

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

void BeginMode3D(Camera camera)

{
  double dVar1;
  Matrix *pMVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  double dVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined8 in_stack_00000008;
  float in_stack_00000010;
  undefined8 in_stack_00000014;
  float in_stack_0000001c;
  undefined8 in_stack_00000020;
  float in_stack_00000028;
  float in_stack_0000002c;
  int in_stack_00000030;
  float16 result;
  float local_48;
  float fStack_44;
  ulong uStack_40;
  float local_38;
  float fStack_34;
  ulong uStack_30;
  float local_28;
  float fStack_24;
  ulong uStack_20;
  ulong local_18;
  float fStack_10;
  undefined4 uStack_c;
  
  rlDrawRenderBatch(RLGL.currentBatch);
  RLGL.State.currentMatrix = &RLGL.State.projection;
  RLGL.State.currentMatrixMode = 0x1701;
  rlPushMatrix();
  pMVar2 = RLGL.State.currentMatrix;
  (RLGL.State.currentMatrix)->m0 = 1.0;
  pMVar2->m4 = 0.0;
  pMVar2->m8 = 0.0;
  pMVar2->m12 = 0.0;
  pMVar2->m1 = 0.0;
  pMVar2->m5 = 1.0;
  pMVar2->m9 = 0.0;
  pMVar2->m13 = 0.0;
  pMVar2->m2 = 0.0;
  pMVar2->m6 = 0.0;
  pMVar2->m10 = 1.0;
  pMVar2->m14 = 0.0;
  pMVar2->m3 = 0.0;
  pMVar2->m7 = 0.0;
  pMVar2->m11 = 0.0;
  pMVar2->m15 = 1.0;
  dVar1 = rlCullDistanceNear;
  uVar3 = (ulong)CORE.Window.currentFbo.width;
  uVar4 = (ulong)CORE.Window.currentFbo.height;
  if (in_stack_00000030 == 1) {
    dVar1 = (double)in_stack_0000002c * 0.5;
    dVar6 = (double)((float)uVar3 / (float)uVar4) * dVar1;
    rlOrtho(-dVar6,dVar6,-dVar1,dVar1,rlCullDistanceNear,rlCullDistanceFar);
  }
  else if (in_stack_00000030 == 0) {
    dVar6 = tan((double)in_stack_0000002c * 0.5 * 0.01745329238474369);
    dVar1 = dVar1 * dVar6;
    dVar6 = (double)((float)uVar3 / (float)uVar4) * dVar1;
    rlFrustum(-dVar6,dVar6,-dVar1,dVar1,rlCullDistanceNear,rlCullDistanceFar);
  }
  RLGL.State.currentMatrix = &RLGL.State.modelview;
  RLGL.State.currentMatrixMode = 0x1700;
  RLGL.State.modelview.m0 = 1.0;
  RLGL.State.modelview.m4 = 0.0;
  RLGL.State.modelview.m8 = 0.0;
  RLGL.State.modelview.m12 = 0.0;
  RLGL.State.modelview.m1 = 0.0;
  RLGL.State.modelview.m5 = 1.0;
  RLGL.State.modelview.m9 = 0.0;
  RLGL.State.modelview.m13 = 0.0;
  RLGL.State.modelview.m2 = 0.0;
  RLGL.State.modelview.m6 = 0.0;
  RLGL.State.modelview.m10 = 1.0;
  RLGL.State.modelview.m14 = 0.0;
  RLGL.State.modelview.m3 = 0.0;
  RLGL.State.modelview.m7 = 0.0;
  RLGL.State.modelview.m11 = 0.0;
  RLGL.State.modelview.m15 = 1.0;
  fVar7 = (float)in_stack_00000008;
  fVar9 = (float)((ulong)in_stack_00000008 >> 0x20);
  fVar10 = (float)((ulong)in_stack_00000020 >> 0x20);
  fVar13 = fVar7 - (float)in_stack_00000014;
  fVar14 = fVar9 - (float)((ulong)in_stack_00000014 >> 0x20);
  fVar15 = in_stack_00000010 - in_stack_0000001c;
  fVar5 = fVar15 * fVar15 + fVar13 * fVar13 + fVar14 * fVar14;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = (float)(-(uint)(fVar5 == 0.0) & 0x3f800000 | ~-(uint)(fVar5 == 0.0) & (uint)(1.0 / fVar5))
  ;
  fVar13 = fVar13 * fVar5;
  fVar14 = fVar14 * fVar5;
  fVar15 = fVar15 * fVar5;
  fVar16 = fVar10 * fVar15 - in_stack_00000028 * fVar14;
  fVar12 = in_stack_00000028 * fVar13 - fVar15 * (float)in_stack_00000020;
  fVar10 = (float)in_stack_00000020 * fVar14 - fVar13 * fVar10;
  fVar5 = fVar10 * fVar10 + fVar16 * fVar16 + fVar12 * fVar12;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = (float)(-(uint)(fVar5 == 0.0) & 0x3f800000 | ~-(uint)(fVar5 == 0.0) & (uint)(1.0 / fVar5))
  ;
  fVar16 = fVar16 * fVar5;
  fVar12 = fVar12 * fVar5;
  fVar5 = fVar5 * fVar10;
  fVar10 = fVar14 * fVar5 - fVar12 * fVar15;
  fVar8 = fVar15 * fVar16 - fVar5 * fVar13;
  fVar11 = fVar13 * fVar12 + -fVar14 * fVar16;
  _local_48 = CONCAT44(fVar10,fVar16);
  uStack_40 = (ulong)(uint)fVar13;
  _local_38 = CONCAT44(fVar8,fVar12);
  uStack_30 = (ulong)(uint)fVar14;
  _local_28 = CONCAT44(fVar11,fVar5);
  uStack_20 = (ulong)(uint)fVar15;
  local_18 = CONCAT44(fVar11 * in_stack_00000010 + fVar10 * fVar7 + fVar9 * fVar8,
                      fVar5 * in_stack_00000010 + fVar16 * fVar7 + fVar9 * fVar12) ^
             0x8000000080000000;
  _fStack_10 = CONCAT44(0x3f800000,-(in_stack_00000010 * fVar15 + fVar7 * fVar13 + fVar9 * fVar14));
  rlMultMatrixf(&local_48);
  (*glad_glEnable)(0xb71);
  return;
}

Assistant:

void BeginMode3D(Camera camera)
{
    rlDrawRenderBatchActive();      // Update and draw internal render batch

    rlMatrixMode(RL_PROJECTION);    // Switch to projection matrix
    rlPushMatrix();                 // Save previous matrix, which contains the settings for the 2d ortho projection
    rlLoadIdentity();               // Reset current matrix (projection)

    float aspect = (float)CORE.Window.currentFbo.width/(float)CORE.Window.currentFbo.height;

    // NOTE: zNear and zFar values are important when computing depth buffer values
    if (camera.projection == CAMERA_PERSPECTIVE)
    {
        // Setup perspective projection
        double top = rlGetCullDistanceNear()*tan(camera.fovy*0.5*DEG2RAD);
        double right = top*aspect;

        rlFrustum(-right, right, -top, top, rlGetCullDistanceNear(), rlGetCullDistanceFar());
    }
    else if (camera.projection == CAMERA_ORTHOGRAPHIC)
    {
        // Setup orthographic projection
        double top = camera.fovy/2.0;
        double right = top*aspect;

        rlOrtho(-right, right, -top,top, rlGetCullDistanceNear(), rlGetCullDistanceFar());
    }

    rlMatrixMode(RL_MODELVIEW);     // Switch back to modelview matrix
    rlLoadIdentity();               // Reset current matrix (modelview)

    // Setup Camera view
    Matrix matView = MatrixLookAt(camera.position, camera.target, camera.up);
    rlMultMatrixf(MatrixToFloat(matView));      // Multiply modelview matrix by view matrix (camera)

    rlEnableDepthTest();            // Enable DEPTH_TEST for 3D
}